

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeAttach(Parse *pParse,int type,FuncDef *pFunc,Expr *pAuthArg,Expr *pFilename,Expr *pDbname,
               Expr *pKey)

{
  sqlite3 *db;
  int iVar1;
  Vdbe *p;
  char *zArg1;
  NameContext local_68;
  
  db = pParse->db;
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.ncFlags = '\0';
  local_68._49_7_ = 0;
  local_68.pAggInfo = (AggInfo *)0x0;
  local_68.pNext = (NameContext *)0x0;
  local_68.pSrcList = (SrcList *)0x0;
  local_68.pEList = (ExprList *)0x0;
  local_68.pParse = pParse;
  iVar1 = resolveAttachExpr(&local_68,pFilename);
  if (iVar1 == 0) {
    iVar1 = resolveAttachExpr(&local_68,pDbname);
    if (iVar1 == 0) {
      iVar1 = resolveAttachExpr(&local_68,pKey);
      if (iVar1 == 0) {
        if (pAuthArg != (Expr *)0x0) {
          if (pAuthArg->op == '^') {
            zArg1 = (pAuthArg->u).zToken;
          }
          else {
            zArg1 = (char *)0x0;
          }
          iVar1 = sqlite3AuthCheck(pParse,type,zArg1,(char *)0x0,(char *)0x0);
          if (iVar1 != 0) goto LAB_0017278f;
        }
        p = sqlite3GetVdbe(pParse);
        if (pParse->nRangeReg < 4) {
          iVar1 = pParse->nMem + 1;
          pParse->nMem = pParse->nMem + 4;
        }
        else {
          iVar1 = pParse->iRangeReg;
          pParse->iRangeReg = iVar1 + 4;
          pParse->nRangeReg = pParse->nRangeReg + -4;
        }
        sqlite3ExprCode(pParse,pFilename,iVar1);
        sqlite3ExprCode(pParse,pDbname,iVar1 + 1);
        sqlite3ExprCode(pParse,pKey,iVar1 + 2);
        if (p != (Vdbe *)0x0) {
          sqlite3VdbeAddOp3(p,0x12,0,(iVar1 + 3) - (int)pFunc->nArg,iVar1 + 3);
          if (p->aOp != (Op *)0x0) {
            p->aOp[(long)p->nOp + -1].p5 = (u8)pFunc->nArg;
          }
          sqlite3VdbeChangeP4(p,-1,(char *)pFunc,-5);
          sqlite3VdbeAddOp3(p,0x81,(uint)(type == 0x18),0,0);
        }
        goto LAB_0017278f;
      }
    }
  }
  pParse->nErr = pParse->nErr + 1;
LAB_0017278f:
  sqlite3ExprDelete(db,pFilename);
  sqlite3ExprDelete(db,pDbname);
  sqlite3ExprDelete(db,pKey);
  return;
}

Assistant:

static void codeAttach(
  Parse *pParse,       /* The parser context */
  int type,            /* Either SQLITE_ATTACH or SQLITE_DETACH */
  FuncDef const *pFunc,/* FuncDef wrapper for detachFunc() or attachFunc() */
  Expr *pAuthArg,      /* Expression to pass to authorization callback */
  Expr *pFilename,     /* Name of database file */
  Expr *pDbname,       /* Name of the database to use internally */
  Expr *pKey           /* Database key for encryption extension */
){
  int rc;
  NameContext sName;
  Vdbe *v;
  sqlite3* db = pParse->db;
  int regArgs;

  memset(&sName, 0, sizeof(NameContext));
  sName.pParse = pParse;

  if( 
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pFilename)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pDbname)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pKey))
  ){
    pParse->nErr++;
    goto attach_end;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( pAuthArg ){
    char *zAuthArg;
    if( pAuthArg->op==TK_STRING ){
      zAuthArg = pAuthArg->u.zToken;
    }else{
      zAuthArg = 0;
    }
    rc = sqlite3AuthCheck(pParse, type, zAuthArg, 0, 0);
    if(rc!=SQLITE_OK ){
      goto attach_end;
    }
  }
#endif /* SQLITE_OMIT_AUTHORIZATION */


  v = sqlite3GetVdbe(pParse);
  regArgs = sqlite3GetTempRange(pParse, 4);
  sqlite3ExprCode(pParse, pFilename, regArgs);
  sqlite3ExprCode(pParse, pDbname, regArgs+1);
  sqlite3ExprCode(pParse, pKey, regArgs+2);

  assert( v || db->mallocFailed );
  if( v ){
    sqlite3VdbeAddOp3(v, OP_Function, 0, regArgs+3-pFunc->nArg, regArgs+3);
    assert( pFunc->nArg==-1 || (pFunc->nArg&0xff)==pFunc->nArg );
    sqlite3VdbeChangeP5(v, (u8)(pFunc->nArg));
    sqlite3VdbeChangeP4(v, -1, (char *)pFunc, P4_FUNCDEF);

    /* Code an OP_Expire. For an ATTACH statement, set P1 to true (expire this
    ** statement only). For DETACH, set it to false (expire all existing
    ** statements).
    */
    sqlite3VdbeAddOp1(v, OP_Expire, (type==SQLITE_ATTACH));
  }
  
attach_end:
  sqlite3ExprDelete(db, pFilename);
  sqlite3ExprDelete(db, pDbname);
  sqlite3ExprDelete(db, pKey);
}